

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void __thiscall google::protobuf::FileDescriptorProto::Clear(FileDescriptorProto *this)

{
  string *psVar1;
  undefined8 *puVar2;
  uint uVar3;
  long lVar4;
  
  uVar3 = this->_has_bits_[0];
  if ((char)uVar3 != '\0') {
    if (((uVar3 & 1) != 0) &&
       (psVar1 = this->name_, psVar1 != (string *)internal::kEmptyString_abi_cxx11_)) {
      psVar1->_M_string_length = 0;
      *(psVar1->_M_dataplus)._M_p = '\0';
      uVar3 = this->_has_bits_[0];
    }
    if (((uVar3 & 2) != 0) &&
       (psVar1 = this->package_, psVar1 != (string *)internal::kEmptyString_abi_cxx11_)) {
      psVar1->_M_string_length = 0;
      *(psVar1->_M_dataplus)._M_p = '\0';
      uVar3 = this->_has_bits_[0];
    }
  }
  if ((uVar3 & 0x1fe00) != 0) {
    if (((uVar3 >> 9 & 1) != 0) && (this->options_ != (FileOptions *)0x0)) {
      FileOptions::Clear(this->options_);
      uVar3 = this->_has_bits_[0];
    }
    if (((uVar3 >> 10 & 1) != 0) && (this->source_code_info_ != (SourceCodeInfo *)0x0)) {
      SourceCodeInfo::Clear(this->source_code_info_);
    }
  }
  if (0 < (this->dependency_).super_RepeatedPtrFieldBase.current_size_) {
    lVar4 = 0;
    do {
      puVar2 = (undefined8 *)(this->dependency_).super_RepeatedPtrFieldBase.elements_[lVar4];
      puVar2[1] = 0;
      *(undefined1 *)*puVar2 = 0;
      lVar4 = lVar4 + 1;
    } while (lVar4 < (this->dependency_).super_RepeatedPtrFieldBase.current_size_);
  }
  (this->dependency_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->public_dependency_).current_size_ = 0;
  (this->weak_dependency_).current_size_ = 0;
  if (0 < (this->message_type_).super_RepeatedPtrFieldBase.current_size_) {
    lVar4 = 0;
    do {
      (**(code **)(*(this->message_type_).super_RepeatedPtrFieldBase.elements_[lVar4] + 0x20))();
      lVar4 = lVar4 + 1;
    } while (lVar4 < (this->message_type_).super_RepeatedPtrFieldBase.current_size_);
  }
  (this->message_type_).super_RepeatedPtrFieldBase.current_size_ = 0;
  if (0 < (this->enum_type_).super_RepeatedPtrFieldBase.current_size_) {
    lVar4 = 0;
    do {
      (**(code **)(*(this->enum_type_).super_RepeatedPtrFieldBase.elements_[lVar4] + 0x20))();
      lVar4 = lVar4 + 1;
    } while (lVar4 < (this->enum_type_).super_RepeatedPtrFieldBase.current_size_);
  }
  (this->enum_type_).super_RepeatedPtrFieldBase.current_size_ = 0;
  if (0 < (this->service_).super_RepeatedPtrFieldBase.current_size_) {
    lVar4 = 0;
    do {
      (**(code **)(*(this->service_).super_RepeatedPtrFieldBase.elements_[lVar4] + 0x20))();
      lVar4 = lVar4 + 1;
    } while (lVar4 < (this->service_).super_RepeatedPtrFieldBase.current_size_);
  }
  (this->service_).super_RepeatedPtrFieldBase.current_size_ = 0;
  if (0 < (this->extension_).super_RepeatedPtrFieldBase.current_size_) {
    lVar4 = 0;
    do {
      (**(code **)(*(this->extension_).super_RepeatedPtrFieldBase.elements_[lVar4] + 0x20))();
      lVar4 = lVar4 + 1;
    } while (lVar4 < (this->extension_).super_RepeatedPtrFieldBase.current_size_);
  }
  (this->extension_).super_RepeatedPtrFieldBase.current_size_ = 0;
  this->_has_bits_[0] = 0;
  if ((this->_unknown_fields_).fields_ !=
      (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *)0x0
     ) {
    UnknownFieldSet::ClearFallback(&this->_unknown_fields_);
    return;
  }
  return;
}

Assistant:

void FileDescriptorProto::Clear() {
  if (_has_bits_[0 / 32] & (0xffu << (0 % 32))) {
    if (has_name()) {
      if (name_ != &::google::protobuf::internal::kEmptyString) {
        name_->clear();
      }
    }
    if (has_package()) {
      if (package_ != &::google::protobuf::internal::kEmptyString) {
        package_->clear();
      }
    }
  }
  if (_has_bits_[9 / 32] & (0xffu << (9 % 32))) {
    if (has_options()) {
      if (options_ != NULL) options_->::google::protobuf::FileOptions::Clear();
    }
    if (has_source_code_info()) {
      if (source_code_info_ != NULL) source_code_info_->::google::protobuf::SourceCodeInfo::Clear();
    }
  }
  dependency_.Clear();
  public_dependency_.Clear();
  weak_dependency_.Clear();
  message_type_.Clear();
  enum_type_.Clear();
  service_.Clear();
  extension_.Clear();
  ::memset(_has_bits_, 0, sizeof(_has_bits_));
  mutable_unknown_fields()->Clear();
}